

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

DictionaryFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_dictionarytype(FeatureType *this)

{
  DictionaryFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 6) {
    this_00 = (DictionaryFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 6;
    this_00 = (DictionaryFeatureType *)operator_new(0x20);
    DictionaryFeatureType::DictionaryFeatureType(this_00);
    (this->Type_).dictionarytype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::DictionaryFeatureType* FeatureType::mutable_dictionarytype() {
  if (!has_dictionarytype()) {
    clear_Type();
    set_has_dictionarytype();
    Type_.dictionarytype_ = new ::CoreML::Specification::DictionaryFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.dictionaryType)
  return Type_.dictionarytype_;
}